

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlineedit.cpp
# Opt level: O0

void __thiscall QLineEdit::focusOutEvent(QLineEdit *this,QFocusEvent *e)

{
  bool bVar1;
  int iVar2;
  QLineEditPrivate *this_00;
  QWidget *pQVar3;
  QWidgetLineControl *pQVar4;
  QCompleter *pQVar5;
  QLineEditPrivate *in_RSI;
  QWidgetLineControl *in_RDI;
  QLineEditPrivate *unaff_retaddr;
  FocusReason reason;
  QLineEditPrivate *d;
  QLineEditPrivate *in_stack_00000060;
  undefined4 in_stack_ffffffffffffffe0;
  undefined1 visible;
  
  pQVar4 = in_RDI;
  this_00 = d_func((QLineEdit *)0x5c7460);
  visible = (undefined1)((ulong)pQVar4 >> 0x38);
  bVar1 = QWidgetLineControl::passwordEchoEditing(in_RDI);
  if (bVar1) {
    QLineEditPrivate::updatePasswordEchoEditing(in_RSI,SUB81((ulong)this_00 >> 0x38,0));
  }
  iVar2 = QFocusEvent::reason();
  if ((iVar2 != 3) && (iVar2 != 4)) {
    deselect((QLineEdit *)CONCAT44(iVar2,in_stack_ffffffffffffffe0));
  }
  QLineEditPrivate::setCursorVisible(unaff_retaddr,(bool)visible);
  QWidgetLineControl::setBlinkingCursorEnabled((QWidgetLineControl *)this,e._7_1_);
  if ((iVar2 == 4) && (pQVar3 = QApplication::activePopupWidget(), pQVar3 != (QWidget *)0x0)) {
    QApplication::activePopupWidget();
    pQVar4 = (QWidgetLineControl *)QWidget::parentWidget((QWidget *)0x5c74eb);
    if (pQVar4 == in_RDI) goto LAB_005c7552;
  }
  if ((((byte)this_00->field_0x27c >> 5 & 1) != 0) &&
     ((bVar1 = hasAcceptableInput((QLineEdit *)CONCAT44(iVar2,in_stack_ffffffffffffffe0)), bVar1 ||
      (bVar1 = QWidgetLineControl::fixup((QWidgetLineControl *)this_00), bVar1)))) {
    editingFinished((QLineEdit *)0x5c7539);
    this_00->field_0x27c = this_00->field_0x27c & 0xdf;
  }
LAB_005c7552:
  pQVar5 = QWidgetLineControl::completer((QWidgetLineControl *)0x5c7563);
  if (pQVar5 != (QCompleter *)0x0) {
    QLineEditPrivate::disconnectCompleter(in_stack_00000060);
  }
  QWidget::focusOutEvent((QWidget *)CONCAT44(iVar2,in_stack_ffffffffffffffe0),(QFocusEvent *)in_RDI)
  ;
  return;
}

Assistant:

void QLineEdit::focusOutEvent(QFocusEvent *e)
{
    Q_D(QLineEdit);
    if (d->control->passwordEchoEditing()) {
        // Reset the echomode back to PasswordEchoOnEdit when the widget loses
        // focus.
        d->updatePasswordEchoEditing(false);
    }

    Qt::FocusReason reason = e->reason();
    if (reason != Qt::ActiveWindowFocusReason &&
        reason != Qt::PopupFocusReason)
        deselect();

    d->setCursorVisible(false);
    d->control->setBlinkingCursorEnabled(false);
#ifdef QT_KEYPAD_NAVIGATION
    // editingFinished() is already emitted on LeaveEditFocus
    if (!QApplicationPrivate::keypadNavigationEnabled())
#endif
    if (reason != Qt::PopupFocusReason
        || !(QApplication::activePopupWidget() && QApplication::activePopupWidget()->parentWidget() == this)) {
            if (d->edited && (hasAcceptableInput() || d->control->fixup())) {
                emit editingFinished();
                d->edited = false;
            }
    }
#ifdef QT_KEYPAD_NAVIGATION
    d->control->setCancelText(QString());
#endif
#if QT_CONFIG(completer)
    if (d->control->completer())
        d->disconnectCompleter();
#endif
    QWidget::focusOutEvent(e);
}